

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddDecomp.c
# Opt level: O0

int cuddConjunctsAux(DdManager *dd,DdNode *f,DdNode **c1,DdNode **c2)

{
  int iVar1;
  char *value_00;
  NodeStat *pNVar2;
  ulong uVar3;
  ulong uVar4;
  double dVar5;
  Conjuncts *local_b0;
  int local_a4;
  int local_a0;
  int local_9c;
  int maxLocalRef;
  NodeStat *nodeStat;
  int freeFactors;
  double minterms;
  double max;
  int approxDistance;
  int distance;
  Conjuncts *factors;
  char *value;
  char *key;
  st__generator *stGen;
  st__table *ghTable;
  st__table *mintermTable;
  st__table *cacheTable;
  st__table *distanceTable;
  DdNode **c2_local;
  DdNode **c1_local;
  DdNode *f_local;
  DdManager *dd_local;
  
  cacheTable = (st__table *)0x0;
  mintermTable = (st__table *)0x0;
  ghTable = (st__table *)0x0;
  stGen = (st__generator *)0x0;
  *c1 = (DdNode *)0x0;
  *c2 = (DdNode *)0x0;
  distanceTable = (st__table *)c2;
  c2_local = c1;
  c1_local = (DdNode **)f;
  f_local = &dd->sentinel;
  cacheTable = st__init_table(st__ptrcmp,st__ptrhash);
  if ((cacheTable != (st__table *)0x0) && (value_00 = (char *)malloc(8), value_00 != (char *)0x0)) {
    value_00[0] = '\0';
    value_00[1] = '\0';
    value_00[2] = '\0';
    value_00[3] = '\0';
    value_00[4] = '\x01';
    value_00[5] = '\0';
    value_00[6] = '\0';
    value_00[7] = '\0';
    iVar1 = st__insert(cacheTable,(char *)one,value_00);
    if ((iVar1 != -10000) &&
       (pNVar2 = CreateBotDist((DdNode *)c1_local,cacheTable), pNVar2 != (NodeStat *)0x0)) {
      if (pNVar2->distance < 6) {
        local_a0 = 5;
      }
      else {
        local_a0 = pNVar2->distance;
      }
      if (pNVar2->distance < local_a0) {
        *c2_local = (DdNode *)c1_local;
        distanceTable->compare = *(st__compare_func_type *)(f_local + 1);
        *(int *)(((ulong)*c2_local & 0xfffffffffffffffe) + 4) =
             *(int *)(((ulong)*c2_local & 0xfffffffffffffffe) + 4) + 1;
        uVar3 = (ulong)distanceTable->compare & 0xfffffffffffffffe;
        *(int *)(uVar3 + 4) = *(int *)(uVar3 + 4) + 1;
        key = (char *)st__init_gen(cacheTable);
        if ((st__generator *)key != (st__generator *)0x0) {
          while (iVar1 = st__gen((st__generator *)key,&value,(char **)&factors), iVar1 != 0) {
            if (factors != (Conjuncts *)0x0) {
              free(factors);
              factors = (Conjuncts *)0x0;
            }
          }
          st__free_gen((st__generator *)key);
          key = (char *)0x0;
          st__free_table(cacheTable);
          return 1;
        }
        key = (char *)0x0;
      }
      else {
        local_9c = 0;
        key = (char *)st__init_gen(cacheTable);
        if ((st__generator *)key == (st__generator *)0x0) {
          key = (char *)0x0;
        }
        else {
          while (iVar1 = st__gen((st__generator *)key,&value,(char **)&factors), iVar1 != 0) {
            if (local_9c < *(int *)((long)&factors->g + 4)) {
              local_a4 = *(int *)((long)&factors->g + 4);
            }
            else {
              local_a4 = local_9c;
            }
            local_9c = local_a4;
          }
          st__free_gen((st__generator *)key);
          key = (char *)0x0;
          iVar1 = Cudd_SupportSize((DdManager *)f_local,(DdNode *)c1_local);
          dVar5 = pow(2.0,(double)iVar1);
          ghTable = st__init_table(st__ptrcmp,st__ptrhash);
          if (ghTable != (st__table *)0x0) {
            dVar5 = CountMinterms((DdNode *)c1_local,dVar5,ghTable,(FILE *)f_local[0xf].type.kids.T)
            ;
            if ((dVar5 != -1.0) || (NAN(dVar5))) {
              uVar3 = Cudd_Random();
              lastTimeG = uVar3 & 1;
              mintermTable = st__init_table(st__ptrcmp,st__ptrhash);
              if ((mintermTable != (st__table *)0x0) &&
                 ((stGen = (st__generator *)st__init_table(st__ptrcmp,st__ptrhash),
                  (st__table *)stGen != (st__table *)0x0 &&
                  (local_b0 = BuildConjuncts((DdManager *)f_local,(DdNode *)c1_local,cacheTable,
                                             mintermTable,local_a0,local_9c,(st__table *)stGen,
                                             ghTable), local_b0 != (Conjuncts *)0x0)))) {
                key = (char *)st__init_gen(cacheTable);
                if ((st__generator *)key == (st__generator *)0x0) {
                  key = (char *)0x0;
                }
                else {
                  while (iVar1 = st__gen((st__generator *)key,&value,(char **)&factors), iVar1 != 0)
                  {
                    if (factors != (Conjuncts *)0x0) {
                      free(factors);
                      factors = (Conjuncts *)0x0;
                    }
                  }
                  st__free_gen((st__generator *)key);
                  key = (char *)0x0;
                  st__free_table(cacheTable);
                  cacheTable = (st__table *)0x0;
                  st__free_table((st__table *)stGen);
                  stGen = (st__generator *)0x0;
                  key = (char *)st__init_gen(ghTable);
                  if ((st__generator *)key == (st__generator *)0x0) {
                    key = (char *)0x0;
                  }
                  else {
                    while (iVar1 = st__gen((st__generator *)key,&value,(char **)&factors),
                          iVar1 != 0) {
                      if (factors != (Conjuncts *)0x0) {
                        free(factors);
                        factors = (Conjuncts *)0x0;
                      }
                    }
                    st__free_gen((st__generator *)key);
                    key = (char *)0x0;
                    st__free_table(ghTable);
                    ghTable = (st__table *)0x0;
                    uVar3 = (ulong)local_b0 & 1;
                    if (((ulong)local_b0 & 1) != 0) {
                      local_b0 = (Conjuncts *)((ulong)local_b0 ^ 1);
                    }
                    if (local_b0 != (Conjuncts *)0x0) {
                      *c2_local = local_b0->g;
                      distanceTable->compare = (st__compare_func_type)local_b0->h;
                      *(int *)(((ulong)*c2_local & 0xfffffffffffffffe) + 4) =
                           *(int *)(((ulong)*c2_local & 0xfffffffffffffffe) + 4) + 1;
                      uVar4 = (ulong)distanceTable->compare & 0xfffffffffffffffe;
                      *(int *)(uVar4 + 4) = *(int *)(uVar4 + 4) + 1;
                      if ((uVar3 != 0) && (local_b0 != (Conjuncts *)0x0)) {
                        free(local_b0);
                      }
                    }
                    key = (char *)st__init_gen(mintermTable);
                    if ((st__generator *)key != (st__generator *)0x0) {
                      while (iVar1 = st__gen((st__generator *)key,&value,(char **)&factors),
                            iVar1 != 0) {
                        ConjunctsFree((DdManager *)f_local,factors);
                      }
                      st__free_gen((st__generator *)key);
                      key = (char *)0x0;
                      st__free_table(mintermTable);
                      return 1;
                    }
                    key = (char *)0x0;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
LAB_009faa48:
  while (cacheTable != (st__table *)0x0) {
    key = (char *)st__init_gen(cacheTable);
    if ((st__generator *)key != (st__generator *)0x0) {
      while (iVar1 = st__gen((st__generator *)key,&value,(char **)&factors), iVar1 != 0) {
        if (factors != (Conjuncts *)0x0) {
          free(factors);
          factors = (Conjuncts *)0x0;
        }
      }
      st__free_gen((st__generator *)key);
      key = (char *)0x0;
      st__free_table(cacheTable);
      cacheTable = (st__table *)0x0;
      break;
    }
    key = (char *)0x0;
  }
  if (ghTable != (st__table *)0x0) {
    key = (char *)st__init_gen(ghTable);
    if ((st__generator *)key == (st__generator *)0x0) {
      key = (char *)0x0;
      goto LAB_009faa48;
    }
    while (iVar1 = st__gen((st__generator *)key,&value,(char **)&factors), iVar1 != 0) {
      if (factors != (Conjuncts *)0x0) {
        free(factors);
        factors = (Conjuncts *)0x0;
      }
    }
    st__free_gen((st__generator *)key);
    key = (char *)0x0;
    st__free_table(ghTable);
    ghTable = (st__table *)0x0;
  }
  if (stGen != (st__generator *)0x0) {
    st__free_table((st__table *)stGen);
  }
  if (mintermTable == (st__table *)0x0) goto LAB_009fabae;
  key = (char *)st__init_gen(mintermTable);
  if ((st__generator *)key != (st__generator *)0x0) {
    while (iVar1 = st__gen((st__generator *)key,&value,(char **)&factors), iVar1 != 0) {
      ConjunctsFree((DdManager *)f_local,factors);
    }
    st__free_gen((st__generator *)key);
    key = (char *)0x0;
    st__free_table(mintermTable);
LAB_009fabae:
    *(undefined4 *)((long)&f_local[0xf].type + 8) = 1;
    return 0;
  }
  key = (char *)0x0;
  goto LAB_009faa48;
}

Assistant:

static int
cuddConjunctsAux(
  DdManager * dd,
  DdNode * f,
  DdNode ** c1,
  DdNode ** c2)
{
    st__table *distanceTable = NULL;
    st__table *cacheTable = NULL;
    st__table *mintermTable = NULL;
    st__table *ghTable = NULL;
    st__generator *stGen;
    char *key, *value;
    Conjuncts *factors;
    int distance, approxDistance;
    double max, minterms;
    int freeFactors;
    NodeStat *nodeStat;
    int maxLocalRef;
    
    /* initialize */
    *c1 = NULL;
    *c2 = NULL;

    /* initialize distances table */
    distanceTable = st__init_table( st__ptrcmp, st__ptrhash);
    if (distanceTable == NULL) goto outOfMem;
    
    /* make the entry for the constant */
    nodeStat = ABC_ALLOC(NodeStat, 1);
    if (nodeStat == NULL) goto outOfMem;
    nodeStat->distance = 0;
    nodeStat->localRef = 1;
    if ( st__insert(distanceTable, (char *)one, (char *)nodeStat) == st__OUT_OF_MEM) {
        goto outOfMem;
    }

    /* Count node distances from constant. */
    nodeStat = CreateBotDist(f, distanceTable);
    if (nodeStat == NULL) goto outOfMem;

    /* set the distance for the decomposition points */
    approxDistance = (DEPTH < nodeStat->distance) ? nodeStat->distance : DEPTH;
    distance = nodeStat->distance;

    if (distance < approxDistance) {
        /* Too small to bother. */
        *c1 = f;
        *c2 = DD_ONE(dd);
        cuddRef(*c1); cuddRef(*c2);
        stGen = st__init_gen(distanceTable);
        if (stGen == NULL) goto outOfMem;
        while( st__gen(stGen, (const char **)&key, (char **)&value)) {
            ABC_FREE(value);
        }
        st__free_gen(stGen); stGen = NULL;
        st__free_table(distanceTable);
        return(1);
    }

    /* record the maximum local reference count */
    maxLocalRef = 0;
    stGen = st__init_gen(distanceTable);
    if (stGen == NULL) goto outOfMem;
    while( st__gen(stGen, (const char **)&key, (char **)&value)) {
        nodeStat = (NodeStat *)value;
        maxLocalRef = (nodeStat->localRef > maxLocalRef) ?
            nodeStat->localRef : maxLocalRef;
    }
    st__free_gen(stGen); stGen = NULL;

            
    /* Count minterms for each node. */
    max = pow(2.0, (double)Cudd_SupportSize(dd,f)); /* potential overflow */
    mintermTable = st__init_table( st__ptrcmp, st__ptrhash);
    if (mintermTable == NULL) goto outOfMem;
    minterms = CountMinterms(f, max, mintermTable, dd->err);
    if (minterms == -1.0) goto outOfMem;
    
    lastTimeG = Cudd_Random() & 1;
    cacheTable = st__init_table( st__ptrcmp, st__ptrhash);
    if (cacheTable == NULL) goto outOfMem;
    ghTable = st__init_table( st__ptrcmp, st__ptrhash);
    if (ghTable == NULL) goto outOfMem;

    /* Build conjuncts. */
    factors = BuildConjuncts(dd, f, distanceTable, cacheTable,
                             approxDistance, maxLocalRef, ghTable, mintermTable);
    if (factors == NULL) goto outOfMem;

    /* free up tables */
    stGen = st__init_gen(distanceTable);
    if (stGen == NULL) goto outOfMem;
    while( st__gen(stGen, (const char **)&key, (char **)&value)) {
        ABC_FREE(value);
    }
    st__free_gen(stGen); stGen = NULL;
    st__free_table(distanceTable); distanceTable = NULL;
    st__free_table(ghTable); ghTable = NULL;
    
    stGen = st__init_gen(mintermTable);
    if (stGen == NULL) goto outOfMem;
    while( st__gen(stGen, (const char **)&key, (char **)&value)) {
        ABC_FREE(value);
    }
    st__free_gen(stGen); stGen = NULL;
    st__free_table(mintermTable); mintermTable = NULL;

    freeFactors = FactorsNotStored(factors);
    factors = (freeFactors) ? FactorsUncomplement(factors) : factors;
    if (factors != NULL) {
        *c1 = factors->g;
        *c2 = factors->h;
        cuddRef(*c1);
        cuddRef(*c2);
        if (freeFactors) ABC_FREE(factors);
        
#if 0    
        if ((*c1 == f) && (!Cudd_IsConstant(f))) {
            assert(*c2 == one);
        }
        if ((*c2 == f) && (!Cudd_IsConstant(f))) {
            assert(*c1 == one);
        }
        
        if ((*c1 != one) && (!Cudd_IsConstant(f))) {
            assert(!Cudd_bddLeq(dd, *c2, *c1));
        }
        if ((*c2 != one) && (!Cudd_IsConstant(f))) {
            assert(!Cudd_bddLeq(dd, *c1, *c2));
        }
#endif
    }

    stGen = st__init_gen(cacheTable);
    if (stGen == NULL) goto outOfMem;
    while( st__gen(stGen, (const char **)&key, (char **)&value)) {
        ConjunctsFree(dd, (Conjuncts *)value);
    }
    st__free_gen(stGen); stGen = NULL;

    st__free_table(cacheTable); cacheTable = NULL;

    return(1);

outOfMem:
    if (distanceTable != NULL) {
        stGen = st__init_gen(distanceTable);
        if (stGen == NULL) goto outOfMem;
        while( st__gen(stGen, (const char **)&key, (char **)&value)) {
            ABC_FREE(value);
        }
        st__free_gen(stGen); stGen = NULL;
        st__free_table(distanceTable); distanceTable = NULL;
    }
    if (mintermTable != NULL) {
        stGen = st__init_gen(mintermTable);
        if (stGen == NULL) goto outOfMem;
        while( st__gen(stGen, (const char **)&key, (char **)&value)) {
            ABC_FREE(value);
        }
        st__free_gen(stGen); stGen = NULL;
        st__free_table(mintermTable); mintermTable = NULL;
    }
    if (ghTable != NULL) st__free_table(ghTable);
    if (cacheTable != NULL) {
        stGen = st__init_gen(cacheTable);
        if (stGen == NULL) goto outOfMem;
        while( st__gen(stGen, (const char **)&key, (char **)&value)) {
            ConjunctsFree(dd, (Conjuncts *)value);
        }
        st__free_gen(stGen); stGen = NULL;
        st__free_table(cacheTable); cacheTable = NULL;
    }
    dd->errorCode = CUDD_MEMORY_OUT;
    return(0);

}